

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupRowVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int **p;
  int **p_00;
  int **p_01;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  int **p_02;
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pointer pnVar5;
  int *piVar6;
  const_iterator __position;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  cpp_dec_float<100U,_int,_void> local_80;
  
  uVar1 = (this->l).firstUpdate;
  piVar4 = (this->l).start;
  iVar15 = piVar4[(int)uVar1];
  pnVar5 = (this->l).rval.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar5 != (this->l).rval.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->l).rval.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar5;
  }
  piVar6 = (this->l).row;
  v = &((this->l).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->m_backend;
  piVar17 = (this->l).idx;
  p = &(this->l).ridx;
  if ((this->l).ridx != (int *)0x0) {
    spx_free<int*>(p);
  }
  p_00 = &(this->l).rbeg;
  if ((this->l).rbeg != (int *)0x0) {
    spx_free<int*>(p_00);
  }
  p_01 = &(this->l).rorig;
  if ((this->l).rorig != (int *)0x0) {
    spx_free<int*>(p_01);
  }
  this_00 = &(this->l).rval;
  p_02 = &(this->l).rperm;
  if ((this->l).rperm != (int *)0x0) {
    spx_free<int*>(p_02);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(this_00,(long)iVar15);
  __position._M_current =
       (this->l).rval.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::insert(this_00,__position,(long)iVar15,(value_type *)&local_80);
  spx_alloc<int*>(p,iVar15);
  spx_alloc<int*>(p_00,this->thedim + 1);
  spx_alloc<int*>(p_01,this->thedim);
  spx_alloc<int*>(p_02,this->thedim);
  piVar7 = (this->l).ridx;
  pnVar5 = (this->l).rval.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar8 = (this->l).rbeg;
  piVar9 = (this->l).rorig;
  piVar10 = (this->row).orig;
  piVar11 = (this->l).rperm;
  piVar12 = (this->row).perm;
  iVar13 = this->thedim;
  for (lVar16 = 0; iVar13 != (int)lVar16; lVar16 = lVar16 + 1) {
    piVar9[lVar16] = piVar10[lVar16];
    piVar11[lVar16] = piVar12[lVar16];
    piVar8[lVar16] = 0;
  }
  piVar8[lVar16] = 0;
  for (lVar16 = 0; iVar15 != (int)lVar16; lVar16 = lVar16 + 1) {
    piVar8[(long)piVar17[lVar16] + 1] = piVar8[(long)piVar17[lVar16] + 1] + 1;
  }
  piVar17 = (this->l).idx;
  iVar15 = this->thedim;
  iVar13 = 0;
  for (lVar16 = 0; iVar15 != (int)lVar16; lVar16 = lVar16 + 1) {
    iVar2 = piVar8[lVar16 + 1];
    piVar8[lVar16 + 1] = iVar13;
    iVar13 = iVar2 + iVar13;
  }
  uVar18 = 0;
  uVar14 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar14 = uVar18;
  }
  iVar15 = 0;
  while (uVar18 != uVar14) {
    iVar13 = piVar6[uVar18];
    uVar18 = uVar18 + 1;
    for (; iVar15 < piVar4[uVar18]; iVar15 = iVar15 + 1) {
      iVar2 = *piVar17;
      piVar17 = piVar17 + 1;
      iVar3 = piVar8[(long)iVar2 + 1];
      piVar8[(long)iVar2 + 1] = iVar3 + 1;
      piVar7[iVar3] = iVar13;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&pnVar5[iVar3].m_backend,v);
      v = v + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::setupRowVals()
{
   int   i, j, k, m;
   int   vecs, mem;
   int*  l_row;
   int*  idx;
   R* val;
   int*  beg;
   int*  l_ridx;
   R* l_rval;
   int*  l_rbeg;
   int*  rorig;
   int*  rrorig;
   int*  rperm;
   int*  rrperm;

   vecs  = l.firstUpdate;
   l_row = l.row;
   idx   = l.idx;
   val   = l.val.data();
   beg   = l.start;
   mem   = beg[vecs];

   if(!l.rval.empty())
   {
      l.rval.clear();
   }


   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   l.rval.reserve(mem);         // small performance improvement before the insertion
   // Insert mem number of zeros.
   l.rval.insert(l.rval.begin(), mem, 0);

   spx_alloc(l.ridx, mem);

   spx_alloc(l.rbeg, thedim + 1);

   spx_alloc(l.rorig, thedim);

   spx_alloc(l.rperm, thedim);

   l_ridx = l.ridx;

   l_rval = l.rval.data();

   l_rbeg = l.rbeg;

   rorig  = l.rorig;

   rrorig = row.orig;

   rperm  = l.rperm;

   rrperm = row.perm;

   for(i = thedim; i--; *l_rbeg++ = 0)
   {
      *rorig++ = *rrorig++;
      *rperm++ = *rrperm++;
   }

   *l_rbeg = 0;

   l_rbeg = l.rbeg + 1;

   for(i = mem; i--;)
      l_rbeg[*idx++]++;

   idx = l.idx;

   for(m = 0, i = thedim; i--; l_rbeg++)
   {
      j = *l_rbeg;
      *l_rbeg = m;
      m += j;
   }

   assert(m == mem);

   l_rbeg = l.rbeg + 1;

   for(i = j = 0; i < vecs; ++i)
   {
      m = l_row[i];
      assert(idx == &l.idx[l.start[i]]);

      for(; j < beg[i + 1]; j++)
      {
         k = l_rbeg[*idx++]++;
         assert(k < mem);
         l_ridx[k] = m;
         l_rval[k] = *val++;
      }
   }

   assert(l.rbeg[thedim] == mem);

   assert(l.rbeg[0] == 0);
}